

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool __thiscall
testing::internal::FloatingPoint<float>::AlmostEquals
          (FloatingPoint<float> *this,FloatingPoint<float> *rhs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  
  uVar1 = (this->u_).bits_;
  if ((~uVar1 & 0x7f800000) != 0 || (uVar1 & 0x7fffff) == 0) {
    uVar2 = (rhs->u_).bits_;
    if ((~uVar2 & 0x7f800000) != 0 || (uVar2 & 0x7fffff) == 0) {
      uVar3 = uVar1 | 0x80000000;
      if ((int)uVar1 < 0) {
        uVar3 = -uVar1;
      }
      uVar1 = uVar2 | 0x80000000;
      if ((int)uVar2 < 0) {
        uVar1 = -uVar2;
      }
      uVar2 = uVar3 - uVar1;
      if (uVar3 < uVar1) {
        uVar2 = -(uVar3 - uVar1);
      }
      bVar4 = uVar2 < 5;
      goto LAB_0016b35f;
    }
  }
  bVar4 = false;
LAB_0016b35f:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool AlmostEquals(const FloatingPoint& rhs) const {
    // The IEEE standard says that any comparison operation involving
    // a NAN must return false.
    if (is_nan() || rhs.is_nan()) return false;

    return DistanceBetweenSignAndMagnitudeNumbers(u_.bits_, rhs.u_.bits_)
        <= kMaxUlps;
  }